

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O0

int mem_gets(BIO *bio,char *buf,int size)

{
  ulong *puVar1;
  void *pvVar2;
  char *newline;
  int ret;
  BUF_MEM *b;
  int size_local;
  char *buf_local;
  BIO *bio_local;
  
  BIO_clear_retry_flags(bio);
  if (size < 1) {
    bio_local._4_4_ = 0;
  }
  else {
    puVar1 = (ulong *)bio->ptr;
    newline._4_4_ = size + -1;
    if (*puVar1 < (ulong)(long)newline._4_4_) {
      newline._4_4_ = (int)*puVar1;
    }
    pvVar2 = OPENSSL_memchr((void *)puVar1[1],10,(long)newline._4_4_);
    if (pvVar2 != (void *)0x0) {
      newline._4_4_ = ((int)pvVar2 - (int)puVar1[1]) + 1;
    }
    bio_local._4_4_ = mem_read(bio,buf,newline._4_4_);
    if (-1 < bio_local._4_4_) {
      buf[bio_local._4_4_] = '\0';
    }
  }
  return bio_local._4_4_;
}

Assistant:

static int mem_gets(BIO *bio, char *buf, int size) {
  BIO_clear_retry_flags(bio);
  if (size <= 0) {
    return 0;
  }

  // The buffer size includes space for the trailing NUL, so we can read at most
  // one fewer byte.
  BUF_MEM *b = reinterpret_cast<BUF_MEM *>(bio->ptr);
  int ret = size - 1;
  if ((size_t)ret > b->length) {
    ret = (int)b->length;
  }

  // Stop at the first newline.
  const char *newline =
      reinterpret_cast<char *>(OPENSSL_memchr(b->data, '\n', ret));
  if (newline != NULL) {
    ret = (int)(newline - b->data + 1);
  }

  ret = mem_read(bio, buf, ret);
  if (ret >= 0) {
    buf[ret] = '\0';
  }
  return ret;
}